

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cvc.c
# Opt level: O3

err_t cmdCVCsFind(size_t *offset,octet *certs,size_t certs_len,octet *cert,size_t cert_len)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (certs_len != 0) {
    sVar3 = 0;
    do {
      sVar2 = btokCVCLen(certs,certs_len);
      if (sVar2 == 0xffffffffffffffff) {
        return 0x204;
      }
      if ((sVar2 == cert_len) && (bVar1 = memEq(certs,cert,cert_len), bVar1 != 0)) {
        if (offset != (size_t *)0x0) {
          *offset = sVar3;
          return 0;
        }
        return 0;
      }
      sVar3 = sVar3 + sVar2;
      certs = certs + sVar2;
      certs_len = certs_len - sVar2;
    } while (certs_len != 0);
  }
  return 0x70;
}

Assistant:

err_t cmdCVCsFind(size_t* offset, const octet* certs, size_t certs_len,
	const octet* cert, size_t cert_len)
{
	size_t pos;
	// pre
	ASSERT(memIsValid(certs, certs_len));
	ASSERT(memIsValid(cert, cert_len));
	ASSERT(memIsNullOrValid(offset, O_PER_S));
	// цикл по сертификатам
	for (pos = 0; certs_len; )
	{
		size_t len = btokCVCLen(certs, certs_len);
		if (len == SIZE_MAX)
			return ERR_BAD_CERTRING;
		if (len == cert_len && memEq(certs, cert, cert_len))
		{
			if (offset)
				*offset = pos;
			return ERR_OK;
		}
		pos += len, certs += len, certs_len -= len;
	}
	return ERR_NOT_FOUND;
}